

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transaction.c
# Opt level: O0

ZyanStatus ZyrexUpdateThread(ZyanThreadId thread_id)

{
  ZyanThreadId ZStack_20;
  ZyanStatus status_047620348;
  ZyanThreadId tid;
  ZyanThreadId thread_id_local;
  
  tid = thread_id;
  thread_id_local._4_4_ = ZyanThreadGetCurrentThreadId(&stack0xffffffffffffffe0);
  if ((thread_id_local._4_4_ & 0x80000000) == 0) {
    if (g_transaction_data.transaction_thread_id == ZStack_20) {
      thread_id_local._4_4_ = 0x100000;
    }
    else {
      thread_id_local._4_4_ = 0x80100005;
    }
  }
  return thread_id_local._4_4_;
}

Assistant:

ZyanStatus ZyrexUpdateThread(ZyanThreadId thread_id)
{
    ZyanThreadId tid;
    ZYAN_CHECK(ZyanThreadGetCurrentThreadId(&tid));

    if (g_transaction_data.transaction_thread_id != tid)
    {
        return ZYAN_STATUS_INVALID_OPERATION;
    }

#ifdef ZYAN_WINDOWS

    ZYAN_ASSERT(g_transaction_data.pending_operations.data);
    ZYAN_ASSERT(g_transaction_data.threads_to_update.data);

    if (thread_id == GetCurrentThreadId())
    {
        return ZYAN_STATUS_SUCCESS;
    }

    const DWORD desired_access = THREAD_SUSPEND_RESUME | THREAD_GET_CONTEXT | THREAD_SET_CONTEXT;
    const HANDLE handle = OpenThread(desired_access, ZYAN_FALSE, thread_id);
    if (handle == ZYAN_NULL)
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }
    if (SuspendThread(handle) == (DWORD)(-1))
    {
        CloseHandle(handle);
        return ZYAN_STATUS_BAD_SYSTEMCALL;
    }

    return ZyanVectorPushBack(&g_transaction_data.threads_to_update, &handle);

#else

    ZYAN_UNUSED(thread_id);
    return ZYAN_STATUS_SUCCESS;

#endif
}